

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool __thiscall
ON_ModelComponent::SetModelComponentStatus
          (ON_ModelComponent *this,ON_ComponentStatus component_status)

{
  bool bVar1;
  bool bContentChange;
  uint bit;
  ON_ModelComponent *this_local;
  ON_ComponentStatus component_status_local;
  
  if ((this->m_locked_status & 0x100) == 0) {
    bVar1 = ON_ComponentStatus::operator!=(&this->m_component_status,component_status);
    this->m_component_status = component_status;
    this->m_set_status = this->m_set_status | 0x100;
    if (bVar1) {
      IncrementContentVersionNumber(this);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ModelComponent::SetModelComponentStatus(
  ON_ComponentStatus component_status
  )
{
  const unsigned int bit = ON_ModelComponent::Attributes::ComponentStatusAttribute;
  if (0 != (bit & m_locked_status))
    return false;

  const bool bContentChange = (m_component_status != component_status);

  m_component_status = component_status;
  m_set_status |= bit;

  if ( bContentChange )
    IncrementContentVersionNumber();

  return true;
}